

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.hh
# Opt level: O3

shared_ptr<const_tchecker::parsing::location_declaration_t> __thiscall
tchecker::parsing::system_declaration_t::get_declaration<tchecker::parsing::location_declaration_t>
          (system_declaration_t *this,string *name,
          declaration_map_t<tchecker::parsing::location_declaration_t> *m)

{
  __buckets_ptr pp_Var1;
  const_iterator cVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_tchecker::parsing::location_declaration_t> sVar3;
  
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(in_RCX,(key_type *)m);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->super_declaration_t)._vptr_declaration_t = (_func_int **)0x0;
    (this->super_declaration_t)._attr._attr._M_h._M_buckets = (__buckets_ptr)0x0;
  }
  else {
    (this->super_declaration_t)._vptr_declaration_t =
         *(_func_int ***)
          ((long)cVar2.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_true>
                 ._M_cur + 0x28);
    pp_Var1 = *(__buckets_ptr *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_true>
                      ._M_cur + 0x30);
    (this->super_declaration_t)._attr._attr._M_h._M_buckets = pp_Var1;
    if (pp_Var1 != (__buckets_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      }
    }
  }
  sVar3.
  super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.
  super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::parsing::location_declaration_t>)
         sVar3.
         super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<T const> get_declaration(std::string const & name, declaration_map_t<T> const & m) const
  {
    auto it = m.find(name);
    if (it == m.end())
      return nullptr;
    return it->second;
  }